

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

bool duckdb::TryCastStringBool(char *input_data,idx_t input_size,bool *result,bool strict)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  switch(input_size) {
  case 1:
    uVar2 = tolower((int)*input_data);
    uVar2 = uVar2 & 0xff;
    bVar7 = true;
    if (uVar2 < 0x6e) {
      if (uVar2 != 0x30) {
        if (uVar2 == 0x31) goto LAB_00d22f43;
        if (uVar2 != 0x66) {
          return false;
        }
      }
    }
    else {
      if ((uVar2 == 0x79) || (uVar2 == 0x74)) goto LAB_00d22f43;
      if (uVar2 != 0x6e) {
        return false;
      }
    }
    break;
  case 2:
    uVar2 = tolower((int)*input_data);
    uVar3 = tolower((int)input_data[1]);
    bVar1 = (uVar3 & 0xff) == 0x6f;
    bVar10 = (uVar2 & 0xff) == 0x6e;
    if (!bVar1 || !bVar10) {
      return bVar1 && bVar10;
    }
    break;
  case 3:
    uVar2 = tolower((int)*input_data);
    uVar3 = tolower((int)input_data[1]);
    iVar4 = tolower((int)input_data[2]);
    bVar10 = (uVar3 & 0xff) == 0x65 && (uVar2 & 0xff) == 0x79;
    bVar1 = (char)iVar4 == 's';
    goto LAB_00d22efa;
  case 4:
    uVar2 = tolower((int)*input_data);
    uVar3 = tolower((int)input_data[1]);
    iVar4 = tolower((int)input_data[2]);
    iVar5 = tolower((int)input_data[3]);
    bVar10 = (uVar3 & 0xff) == 0x72 && (uVar2 & 0xff) == 0x74;
    bVar1 = (char)iVar5 == 'e' && (char)iVar4 == 'u';
LAB_00d22efa:
    bVar7 = true;
    if (!(bool)(bVar1 & bVar10)) {
      return false;
    }
    goto LAB_00d22f43;
  case 5:
    uVar2 = tolower((int)*input_data);
    uVar3 = tolower((int)input_data[1]);
    iVar4 = tolower((int)input_data[2]);
    iVar5 = tolower((int)input_data[3]);
    iVar6 = tolower((int)input_data[4]);
    bVar1 = (uVar3 & 0xff) == 0x61;
    bVar10 = (uVar2 & 0xff) == 0x66;
    bVar7 = (char)iVar4 == 'l';
    bVar8 = (char)iVar5 == 's';
    bVar9 = (char)iVar6 == 'e';
    if ((!bVar9 || (!bVar8 || !bVar7)) || (!bVar1 || !bVar10)) {
      return (bVar9 && (bVar8 && bVar7)) && (bVar1 && bVar10);
    }
    break;
  default:
    return false;
  }
  bVar7 = false;
LAB_00d22f43:
  *result = bVar7;
  return true;
}

Assistant:

static inline bool TryCastStringBool(const char *input_data, idx_t input_size, bool &result, bool strict) {
	switch (input_size) {
	case 1: {
		unsigned char c = static_cast<uint8_t>(std::tolower(*input_data));
		if (c == 't' || (!strict && c == 'y') || (!strict && c == '1')) {
			result = true;
			return true;
		} else if (c == 'f' || (!strict && c == 'n') || (!strict && c == '0')) {
			result = false;
			return true;
		}
		return false;
	}
	case 2: {
		unsigned char n = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char o = static_cast<uint8_t>(std::tolower(input_data[1]));
		if (n == 'n' && o == 'o') {
			result = false;
			return true;
		}
		return false;
	}
	case 3: {
		unsigned char y = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char s = static_cast<uint8_t>(std::tolower(input_data[2]));
		if (y == 'y' && e == 'e' && s == 's') {
			result = true;
			return true;
		}
		return false;
	}
	case 4: {
		unsigned char t = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char r = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char u = static_cast<uint8_t>(std::tolower(input_data[2]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[3]));
		if (t == 't' && r == 'r' && u == 'u' && e == 'e') {
			result = true;
			return true;
		}
		return false;
	}
	case 5: {
		unsigned char f = static_cast<uint8_t>(std::tolower(input_data[0]));
		unsigned char a = static_cast<uint8_t>(std::tolower(input_data[1]));
		unsigned char l = static_cast<uint8_t>(std::tolower(input_data[2]));
		unsigned char s = static_cast<uint8_t>(std::tolower(input_data[3]));
		unsigned char e = static_cast<uint8_t>(std::tolower(input_data[4]));
		if (f == 'f' && a == 'a' && l == 'l' && s == 's' && e == 'e') {
			result = false;
			return true;
		}
		return false;
	}
	default:
		return false;
	}
}